

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void sha256msg1_(PDISASM pMyDisasm)

{
  char *pcVar1;
  _Bool _Var2;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if (((pMyDisasm->Reserved_).EVEX.pp == '\x01') && ((pMyDisasm->Reserved_).EVEX.LL == '\x02')) {
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        builtin_strncpy(pcVar1,"vrsqrt28ps",0xb);
      }
      else {
        builtin_strncpy(pcVar1,"vrsqrt28pd",0xb);
      }
      (pMyDisasm->Reserved_).MemDecoration = 0x72;
      (pMyDisasm->Reserved_).Register_ = 0x10;
      GxEx(pMyDisasm);
      return;
    }
  }
  else if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    _Var2 = prefixes_present(pMyDisasm);
    if (!_Var2) {
      (pMyDisasm->Instruction).Category = 0x150000;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"sha256msg1",0xb);
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ sha256msg1_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (
      (GV.EVEX.pp == 1) &&
      (GV.EVEX.LL == 2)
    ) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.EVEX.tupletype = FULL;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrsqrt28ps");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrsqrt28pd");
        #endif
      }
      GV.MemDecoration = Arg2_m512_zmm;
      GV.Register_ = AVX512_REG;
      GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return;}
    pMyDisasm->Instruction.Category = SHA_INSTRUCTION;
    GV.MemDecoration = Arg2_m128_xmm;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "sha256msg1");
    #endif
    GV.Register_ = SSE_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
}